

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O1

Tensor<3> * __thiscall
Omega_h::average_metric<3,4>
          (Tensor<3> *__return_storage_ptr__,Omega_h *this,Few<Omega_h::Matrix<3,_3>,_4> ms,
          bool has_degen)

{
  double dVar1;
  double dVar2;
  Tensor<3> *pTVar3;
  Int j_1;
  long lVar4;
  Int i_2;
  long lVar5;
  double *pdVar6;
  Int j;
  int iVar7;
  long lVar8;
  Matrix<3,_3> *pMVar9;
  double *pdVar10;
  Int i;
  byte bVar11;
  Matrix<3,_3> c;
  Few<Omega_h::Vector<3>,_3> in_stack_00000230;
  double adStack_238 [9];
  Tensor<3> *local_1f0;
  double local_1e8 [4];
  double local_1c8 [6];
  double local_198 [9];
  double local_150 [9];
  double local_108 [9];
  double local_c0 [9];
  double local_78 [9];
  
  bVar11 = 0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_1c8 + lVar4 + 0x30) = 0;
    *(undefined8 *)((long)local_1c8 + lVar4 + 0x38) = 0;
    *(undefined8 *)((long)local_1c8 + lVar4 + 0x40) = 0;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  lVar4 = 0;
  iVar7 = 0;
  local_1f0 = __return_storage_ptr__;
  do {
    if ((char)this == '\0') {
LAB_0035b5d7:
      pMVar9 = ms.array_ + lVar4;
      pdVar6 = adStack_238;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar6 = (pMVar9->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_
                  [0];
        pMVar9 = (Matrix<3,_3> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
        pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
      }
      log_spd_old<3>((Tensor<3>)in_stack_00000230.array_);
      pdVar6 = local_78;
      pdVar10 = local_108;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = *pdVar6;
        pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
      }
      pdVar6 = local_1c8 + 6;
      pdVar10 = local_150;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = *pdVar6;
        pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
      }
      lVar5 = 0;
      do {
        local_1c8[2] = local_150[lVar5 * 3 + 2];
        local_1c8[0] = local_150[lVar5 * 3];
        local_1c8[1] = local_150[lVar5 * 3 + 1];
        local_1e8[2] = local_108[lVar5 * 3 + 2];
        local_1e8[0] = local_108[lVar5 * 3];
        local_1e8[1] = local_108[lVar5 * 3 + 1];
        lVar8 = 0;
        do {
          local_1c8[lVar8 + 3] = local_1c8[lVar8] + local_1e8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_c0[lVar5 * 3] = local_1c8[3];
        local_c0[lVar5 * 3 + 1] = local_1c8[4];
        local_c0[lVar5 * 3 + 2] = local_1c8[5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pdVar6 = local_c0;
      pdVar10 = local_1c8 + 6;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = *pdVar6;
        pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
      }
      iVar7 = iVar7 + 1;
    }
    else {
      pMVar9 = ms.array_ + lVar4;
      pdVar6 = local_108;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar6 = (pMVar9->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_
                  [0];
        pMVar9 = (Matrix<3,_3> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
        pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
      }
      dVar1 = 0.0;
      lVar5 = 0;
      pdVar6 = local_108;
      do {
        lVar8 = 0;
        dVar2 = dVar1;
        do {
          dVar1 = ABS(pdVar6[lVar8]);
          if (ABS(pdVar6[lVar8]) <= dVar2) {
            dVar1 = dVar2;
          }
          lVar8 = lVar8 + 1;
          dVar2 = dVar1;
        } while (lVar8 != 3);
        lVar5 = lVar5 + 1;
        pdVar6 = pdVar6 + 3;
      } while (lVar5 != 3);
      if (1e-10 <= dVar1) goto LAB_0035b5d7;
    }
    pTVar3 = local_1f0;
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      pdVar6 = local_1c8 + 6;
      pdVar10 = local_c0;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar10 = *pdVar6;
        pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
      }
      if ((char)this == '\x01' && iVar7 == 0) {
        pdVar6 = local_1c8 + 6;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          (local_1f0->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_[0] =
               *pdVar6;
          pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
          local_1f0 = (Tensor<3> *)((long)local_1f0 + ((ulong)bVar11 * -2 + 1) * 8);
        }
      }
      else {
        pdVar6 = local_1c8 + 6;
        pdVar10 = local_108;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          *pdVar10 = *pdVar6;
          pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
          pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
        }
        lVar4 = 0;
        do {
          local_78[2] = local_108[lVar4 * 3 + 2];
          local_78[0] = local_108[lVar4 * 3];
          local_78[1] = local_108[lVar4 * 3 + 1];
          lVar5 = 0;
          do {
            local_1e8[lVar5] = local_78[lVar5] / (double)iVar7;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          local_150[lVar4 * 3] = local_1e8[0];
          local_150[lVar4 * 3 + 1] = local_1e8[1];
          local_150[lVar4 * 3 + 2] = local_1e8[2];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        pdVar6 = local_150;
        pdVar10 = local_c0;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          *pdVar10 = *pdVar6;
          pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
          pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
        }
        pdVar6 = local_c0;
        pdVar10 = adStack_238;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          *pdVar10 = *pdVar6;
          pdVar6 = pdVar6 + (ulong)bVar11 * -2 + 1;
          pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
        }
        exp_spd_old<3>((Tensor<3>)in_stack_00000230.array_);
      }
      return pTVar3;
    }
  } while( true );
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> average_metric(
    Few<Tensor<dim>, n> const ms, bool const has_degen) {
  auto am = zero_matrix<dim, dim>();
  Int ngood = 0;
  for (Int i = 0; i < n; ++i) {
    average_metric_contrib(am, ngood, ms[i], has_degen);
  }
  return average_metric_finish(am, ngood, has_degen);
}